

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_vostat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *obj_00;
  long in_RDI;
  char *blah;
  int nMatch;
  int vnum;
  bool found;
  OBJ_DATA *obj;
  OBJ_INDEX_DATA *pObjIndex;
  char arg1 [4608];
  char buf [4608];
  char *in_stack_ffffffffffffdbb8;
  char *in_stack_ffffffffffffdbc0;
  undefined4 in_stack_ffffffffffffdbc8;
  int vnum_00;
  int in_stack_ffffffffffffdbd0;
  uint3 in_stack_ffffffffffffdbd4;
  uint uVar2;
  OBJ_DATA *obj_01;
  char local_2418 [132];
  int in_stack_ffffffffffffdc6c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffdc70;
  char local_1218 [4568];
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  obj_01 = (OBJ_DATA *)0x0;
  uVar2 = (uint)in_stack_ffffffffffffdbd4;
  vnum_00 = 0;
  one_argument(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  if (local_2418[0] == '\0') {
    send_to_char((char *)CONCAT44(uVar2,in_stack_ffffffffffffdbd0),
                 (CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbc8));
  }
  else {
    bVar1 = is_number(in_stack_ffffffffffffdbb8);
    if (bVar1) {
      atoi(local_2418);
      obj_01 = (OBJ_DATA *)get_obj_index(vnum_00);
      if (obj_01 == (OBJ_DATA *)0x0) {
        send_to_char((char *)CONCAT44(uVar2,in_stack_ffffffffffffdbd0),
                     (CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbc8));
        return;
      }
      uVar2 = CONCAT13(1,(int3)uVar2);
    }
    bVar1 = is_number(in_stack_ffffffffffffdbb8);
    if (!bVar1) {
      in_stack_ffffffffffffdbd0 = 0;
      while (vnum_00 < top_obj_index) {
        obj_01 = (OBJ_DATA *)get_obj_index(vnum_00);
        if (obj_01 != (OBJ_DATA *)0x0) {
          vnum_00 = vnum_00 + 1;
          bVar1 = is_name(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          if (bVar1) {
            uVar2 = CONCAT13(1,(int3)uVar2);
            break;
          }
        }
        in_stack_ffffffffffffdbd0 = in_stack_ffffffffffffdbd0 + 1;
      }
    }
    if (((uVar2 & 0x1000000) == 0) || (obj_01 == (OBJ_DATA *)0x0)) {
      send_to_char((char *)CONCAT44(uVar2,in_stack_ffffffffffffdbd0),
                   (CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbc8));
    }
    else {
      *(short *)obj_01->res_flags = (short)obj_01->res_flags[0] + -1;
      obj_00 = create_object(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c);
      obj_to_room(obj_00,*(ROOM_INDEX_DATA **)(in_RDI + 0xa8));
      sprintf(local_1218,"%s",obj_00->name);
      do_ostat((CHAR_DATA *)buf._576_8_,(char *)buf._568_8_);
      extract_obj(obj_01);
      *(short *)obj_01->res_flags = (short)obj_01->res_flags[0] + 1;
    }
  }
  return;
}

Assistant:

void do_vostat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex = nullptr;
	OBJ_DATA *obj;
	bool found = false;
	int vnum, nMatch = 0;
	char *blah;
	blah = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: vostat [vnum] or vostat [name]\n\r", ch);
		return;
	}

	if (is_number(arg1))
	{
		pObjIndex = get_obj_index(atoi(arg1));

		if (pObjIndex == nullptr)
		{
			send_to_char("No object has that vnum.\n\r", ch);
			return;
		}

		found = true;
	}

	if (!is_number(arg1))
	{
		for (vnum = 0; nMatch < top_obj_index; vnum++)
		{
			pObjIndex = get_obj_index(vnum);

			if (pObjIndex != nullptr)
			{
				nMatch++;

				if (is_name(argument, pObjIndex->name))
				{
					found = true;
					break;
				}
			}
		}
	}

	if (!found || !pObjIndex)
	{
		send_to_char("No objects by that name were found.\n\r", ch);
		return;
	}

	pObjIndex->limcount--;

	obj = create_object(pObjIndex, 0);
	obj_to_room(obj, ch->in_room);

	sprintf(buf, "%s", obj->name);
	do_ostat(ch, buf);

	extract_obj(obj);
	pObjIndex->limcount++;
}